

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_create.c
# Opt level: O0

int mbedtls_x509_string_to_names(mbedtls_asn1_named_data **head,char *name)

{
  size_t sVar1;
  char *pcVar2;
  mbedtls_asn1_named_data *pmVar3;
  char **ppcVar4;
  bool bVar5;
  char **local_160;
  char *d;
  char data [256];
  char *pcStack_48;
  int in_tag;
  char *oid;
  char *end;
  char *c;
  char *s;
  int ret;
  char *name_local;
  mbedtls_asn1_named_data **head_local;
  
  sVar1 = strlen(name);
  pcVar2 = name + sVar1;
  pcStack_48 = (char *)0x0;
  bVar5 = true;
  local_160 = &d;
  mbedtls_asn1_free_named_data_list(head);
  end = name;
  c = name;
  do {
    if (pcVar2 < end) {
      return 0;
    }
    if ((bVar5) && (*end == '=')) {
      pcStack_48 = x509_at_oid_from_name(c,(long)end - (long)c);
      if (pcStack_48 == (char *)0x0) {
        return -0x2100;
      }
      c = end + 1;
      bVar5 = false;
      local_160 = &d;
    }
    if (((bVar5) || (*end != '\\')) || (end == pcVar2)) {
      if ((!bVar5) && ((*end == ',' || (end == pcVar2)))) {
        sVar1 = strlen(pcStack_48);
        pmVar3 = mbedtls_asn1_store_named_data
                           (head,pcStack_48,sVar1,(uchar *)&d,(long)local_160 - (long)&d);
        if (pmVar3 == (mbedtls_asn1_named_data *)0x0) {
          return -0x2880;
        }
        while( true ) {
          bVar5 = false;
          if (end < pcVar2) {
            bVar5 = end[1] == ' ';
          }
          if (!bVar5) break;
          end = end + 1;
        }
        c = end + 1;
        bVar5 = true;
      }
    }
    else {
      end = end + 1;
      if ((end == pcVar2) || (*end != ',')) {
        return -0x2380;
      }
    }
    if ((!bVar5) && (c != end + 1)) {
      ppcVar4 = (char **)((long)local_160 + 1);
      *(char *)local_160 = *end;
      local_160 = ppcVar4;
      if ((long)ppcVar4 - (long)&d == 0x100) {
        return -0x2380;
      }
    }
    end = end + 1;
  } while( true );
}

Assistant:

int mbedtls_x509_string_to_names( mbedtls_asn1_named_data **head, const char *name )
{
    int ret = 0;
    const char *s = name, *c = s;
    const char *end = s + strlen( s );
    const char *oid = NULL;
    int in_tag = 1;
    char data[MBEDTLS_X509_MAX_DN_NAME_SIZE];
    char *d = data;

    /* Clear existing chain if present */
    mbedtls_asn1_free_named_data_list( head );

    while( c <= end )
    {
        if( in_tag && *c == '=' )
        {
            if( ( oid = x509_at_oid_from_name( s, c - s ) ) == NULL )
            {
                ret = MBEDTLS_ERR_X509_UNKNOWN_OID;
                goto exit;
            }

            s = c + 1;
            in_tag = 0;
            d = data;
        }

        if( !in_tag && *c == '\\' && c != end )
        {
            c++;

            /* Check for valid escaped characters */
            if( c == end || *c != ',' )
            {
                ret = MBEDTLS_ERR_X509_INVALID_NAME;
                goto exit;
            }
        }
        else if( !in_tag && ( *c == ',' || c == end ) )
        {
            if( mbedtls_asn1_store_named_data( head, oid, strlen( oid ),
                                       (unsigned char *) data,
                                       d - data ) == NULL )
            {
                return( MBEDTLS_ERR_X509_ALLOC_FAILED );
            }

            while( c < end && *(c + 1) == ' ' )
                c++;

            s = c + 1;
            in_tag = 1;
        }

        if( !in_tag && s != c + 1 )
        {
            *(d++) = *c;

            if( d - data == MBEDTLS_X509_MAX_DN_NAME_SIZE )
            {
                ret = MBEDTLS_ERR_X509_INVALID_NAME;
                goto exit;
            }
        }

        c++;
    }

exit:

    return( ret );
}